

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.h
# Opt level: O3

float RandomFloat(float a,float b)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint_fast16_t uVar4;
  uint_fast16_t uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar4 = g_prng_rand_state.c;
  bVar8 = g_prng_rand_state.c != 0;
  uVar5 = g_prng_rand_state.c - 1;
  g_prng_rand_state.c = 0x36;
  if (bVar8) {
    g_prng_rand_state.c = uVar5;
  }
  uVar6 = 0;
  do {
    iVar2 = (int)g_prng_rand_state.i;
    iVar3 = (int)uVar6;
    uVar7 = g_prng_rand_state.s[iVar2 + iVar3 + 9U & 0x3f] +
            g_prng_rand_state.s[iVar2 + iVar3 + 0x28U & 0x3f];
    uVar1 = uVar6 + 1;
    g_prng_rand_state.s[iVar2 + iVar3 & 0x3f] = uVar7;
    if (uVar4 != 0) break;
    bVar8 = uVar6 < 0x1ef;
    uVar6 = uVar1;
  } while (bVar8);
  g_prng_rand_state.i = g_prng_rand_state.i + uVar1;
  return (b - a) * (float)uVar7 * 5.421011e-20 + a;
}

Assistant:

static inline uint64_t prng_rand(struct prng_rand_t* state)
{
    uint_fast16_t i;
    uint_fast16_t r, new_rands = 0;

    if (!state->c)
    {   // Randomness exhausted, run forward to refill
        new_rands += RAND_REFILL_COUNT + 1;
        state->c = RAND_EXHAUST_LIMIT - 1;
    }
    else
    {
        new_rands = 1;
        state->c--;
    }

    for (r = 0; r < new_rands; r++)
    {
        i = state->i;
        state->s[i & RAND_SMASK] = state->s[(i + RAND_SSIZE - LAG1) & RAND_SMASK]
                                   + state->s[(i + RAND_SSIZE - LAG2) & RAND_SMASK];
        state->i++;
    }
    return state->s[i & RAND_SMASK];
}